

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collada.cpp
# Opt level: O0

void CGL::Collada::ColladaParser::parse_node(XMLElement *xml)

{
  char cVar1;
  bool bVar2;
  _Ios_Openmode _Var3;
  char *pcVar4;
  double *pdVar5;
  XMLElement *pXVar6;
  CameraInfo *camera_00;
  undefined1 (*pauVar7) [32];
  XMLElement *in_RDI;
  undefined1 auVar8 [16];
  undefined1 auVar9 [32];
  MaterialInfo *material_1;
  XMLElement *e_material_1;
  string material_id_1;
  XMLElement *e_instance_material_1;
  SphereInfo *sphere;
  MaterialInfo *material;
  XMLElement *e_material;
  string material_id;
  XMLElement *e_instance_material;
  PolymeshInfo *polymesh;
  LightInfo *light;
  CameraInfo *camera;
  XMLElement *e_geometry;
  XMLElement *e_light;
  XMLElement *e_camera;
  XMLElement *e_child;
  Matrix4x4 transform_save;
  stringstream ss_3;
  string s_3;
  Matrix4x4 m_2;
  stringstream ss_2;
  string s_2;
  Matrix4x4 m_1;
  string sid;
  stringstream ss_1;
  string s_1;
  Matrix4x4 m;
  Matrix4x4 mat;
  stringstream ss;
  string s;
  string name;
  XMLElement *e;
  Node node;
  int j;
  XMLElement *in_stack_ffffffffffffee08;
  int i;
  Node *in_stack_ffffffffffffee10;
  value_type *in_stack_ffffffffffffee18;
  Node *in_stack_ffffffffffffee20;
  Matrix4x4 *in_stack_ffffffffffffee28;
  Matrix4x4 *in_stack_ffffffffffffee30;
  SphereInfo *sphere_00;
  XMLElement *in_stack_ffffffffffffee70;
  Matrix4x4 *in_stack_ffffffffffffee78;
  LightInfo *in_stack_ffffffffffffeea0;
  string *in_stack_fffffffffffff068;
  XMLElement *in_stack_fffffffffffff070;
  string local_ed0 [32];
  Node *local_eb0;
  undefined1 local_ea1 [40];
  allocator local_e79;
  string local_e78 [32];
  XMLElement *local_e58;
  undefined8 local_e50;
  undefined1 local_e41 [41];
  string local_e18 [32];
  XMLElement *local_df8;
  allocator local_de9;
  string local_de8 [39];
  allocator local_dc1;
  string local_dc0 [32];
  XMLElement *local_da0;
  undefined1 (*local_d98) [32];
  allocator local_d89;
  string local_d88 [32];
  undefined1 (*local_d68) [32];
  undefined1 (*local_d60) [32];
  allocator local_d51;
  string local_d50 [32];
  XMLElement *local_d30;
  allocator local_d21;
  string local_d20 [32];
  XMLElement *local_d00;
  allocator local_cf1;
  string local_cf0 [32];
  CameraInfo *local_cd0;
  allocator local_cc1;
  string local_cc0 [32];
  XMLElement *local_ca0;
  undefined8 local_c98;
  undefined8 uStack_c90;
  undefined8 uStack_c88;
  undefined8 uStack_c80;
  undefined8 local_c78;
  undefined8 uStack_c70;
  undefined8 uStack_c68;
  undefined8 uStack_c60;
  undefined8 local_c58;
  undefined8 uStack_c50;
  undefined8 uStack_c48;
  undefined8 uStack_c40;
  undefined8 local_c38;
  undefined8 uStack_c30;
  undefined8 uStack_c28;
  XMLElement *pXStack_c20;
  undefined8 local_c18;
  undefined8 uStack_c10;
  undefined8 uStack_c08;
  undefined8 uStack_c00;
  undefined8 local_bf8;
  undefined8 uStack_bf0;
  undefined8 uStack_be8;
  undefined8 uStack_be0;
  undefined8 local_bd8;
  undefined8 uStack_bd0;
  undefined8 uStack_bc8;
  undefined8 uStack_bc0;
  undefined8 local_bb8;
  undefined8 uStack_bb0;
  undefined8 uStack_ba8;
  undefined8 uStack_ba0;
  undefined1 local_b98 [48];
  LightInfo *in_stack_fffffffffffff498;
  XMLElement *in_stack_fffffffffffff4a0;
  stringstream local_b18 [399];
  allocator local_989;
  string local_988 [160];
  undefined1 local_8e8 [128];
  stringstream local_868 [240];
  MaterialInfo *in_stack_fffffffffffff888;
  XMLElement *in_stack_fffffffffffff890;
  PolymeshInfo *in_stack_fffffffffffff898;
  XMLElement *in_stack_fffffffffffff8a0;
  allocator local_6d9;
  string local_6d8 [160];
  undefined1 local_638 [143];
  allocator local_5a9;
  string local_5a8 [32];
  stringstream local_588 [399];
  allocator local_3f9;
  string local_3f8 [172];
  int local_34c;
  undefined1 local_348 [128];
  stringstream local_2c8 [399];
  allocator local_139;
  string local_138 [39];
  allocator local_111;
  string local_110 [32];
  XMLElement *local_f0;
  string local_d8 [32];
  string local_b8 [32];
  undefined1 (*local_98) [32];
  undefined8 local_88 [15];
  
  Node::Node(in_stack_ffffffffffffee20);
  pcVar4 = tinyxml2::XMLElement::Attribute
                     ((XMLElement *)in_stack_ffffffffffffee18,(char *)in_stack_ffffffffffffee10,
                      (char *)in_stack_ffffffffffffee08);
  std::__cxx11::string::operator=(local_d8,pcVar4);
  pcVar4 = tinyxml2::XMLElement::Attribute
                     ((XMLElement *)in_stack_ffffffffffffee18,(char *)in_stack_ffffffffffffee10,
                      (char *)in_stack_ffffffffffffee08);
  std::__cxx11::string::operator=(local_b8,pcVar4);
  local_f0 = tinyxml2::XMLNode::FirstChildElement
                       ((XMLNode *)in_stack_ffffffffffffee10,(char *)in_stack_ffffffffffffee08);
  do {
    if (local_f0 == (XMLElement *)0x0) break;
    pcVar4 = tinyxml2::XMLElement::Name((XMLElement *)0x11f785);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_110,pcVar4,&local_111);
    std::allocator<char>::~allocator((allocator<char> *)&local_111);
    bVar2 = std::operator==(&in_stack_ffffffffffffee10->id,(char *)in_stack_ffffffffffffee08);
    if (bVar2) {
      pcVar4 = tinyxml2::XMLElement::GetText(in_stack_ffffffffffffee08);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_138,pcVar4,&local_139);
      std::allocator<char>::~allocator((allocator<char> *)&local_139);
      _Var3 = std::operator|(_S_out,_S_in);
      std::__cxx11::stringstream::stringstream(local_2c8,local_138,_Var3);
      Matrix4x4::Matrix4x4((Matrix4x4 *)in_stack_ffffffffffffee20);
      pdVar5 = Matrix4x4::operator()
                         ((Matrix4x4 *)in_stack_ffffffffffffee10,
                          (int)((ulong)in_stack_ffffffffffffee08 >> 0x20),
                          (int)in_stack_ffffffffffffee08);
      std::istream::operator>>((istream *)local_2c8,pdVar5);
      pdVar5 = Matrix4x4::operator()
                         ((Matrix4x4 *)in_stack_ffffffffffffee10,
                          (int)((ulong)in_stack_ffffffffffffee08 >> 0x20),
                          (int)in_stack_ffffffffffffee08);
      std::istream::operator>>((istream *)local_2c8,pdVar5);
      pdVar5 = Matrix4x4::operator()
                         ((Matrix4x4 *)in_stack_ffffffffffffee10,
                          (int)((ulong)in_stack_ffffffffffffee08 >> 0x20),
                          (int)in_stack_ffffffffffffee08);
      std::istream::operator>>((istream *)local_2c8,pdVar5);
      pdVar5 = Matrix4x4::operator()
                         ((Matrix4x4 *)in_stack_ffffffffffffee10,
                          (int)((ulong)in_stack_ffffffffffffee08 >> 0x20),
                          (int)in_stack_ffffffffffffee08);
      std::istream::operator>>((istream *)local_2c8,pdVar5);
      pdVar5 = Matrix4x4::operator()
                         ((Matrix4x4 *)in_stack_ffffffffffffee10,
                          (int)((ulong)in_stack_ffffffffffffee08 >> 0x20),
                          (int)in_stack_ffffffffffffee08);
      std::istream::operator>>((istream *)local_2c8,pdVar5);
      pdVar5 = Matrix4x4::operator()
                         ((Matrix4x4 *)in_stack_ffffffffffffee10,
                          (int)((ulong)in_stack_ffffffffffffee08 >> 0x20),
                          (int)in_stack_ffffffffffffee08);
      std::istream::operator>>((istream *)local_2c8,pdVar5);
      pdVar5 = Matrix4x4::operator()
                         ((Matrix4x4 *)in_stack_ffffffffffffee10,
                          (int)((ulong)in_stack_ffffffffffffee08 >> 0x20),
                          (int)in_stack_ffffffffffffee08);
      std::istream::operator>>((istream *)local_2c8,pdVar5);
      pdVar5 = Matrix4x4::operator()
                         ((Matrix4x4 *)in_stack_ffffffffffffee10,
                          (int)((ulong)in_stack_ffffffffffffee08 >> 0x20),
                          (int)in_stack_ffffffffffffee08);
      std::istream::operator>>((istream *)local_2c8,pdVar5);
      pdVar5 = Matrix4x4::operator()
                         ((Matrix4x4 *)in_stack_ffffffffffffee10,
                          (int)((ulong)in_stack_ffffffffffffee08 >> 0x20),
                          (int)in_stack_ffffffffffffee08);
      std::istream::operator>>((istream *)local_2c8,pdVar5);
      pdVar5 = Matrix4x4::operator()
                         ((Matrix4x4 *)in_stack_ffffffffffffee10,
                          (int)((ulong)in_stack_ffffffffffffee08 >> 0x20),
                          (int)in_stack_ffffffffffffee08);
      std::istream::operator>>((istream *)local_2c8,pdVar5);
      pdVar5 = Matrix4x4::operator()
                         ((Matrix4x4 *)in_stack_ffffffffffffee10,
                          (int)((ulong)in_stack_ffffffffffffee08 >> 0x20),
                          (int)in_stack_ffffffffffffee08);
      std::istream::operator>>((istream *)local_2c8,pdVar5);
      pdVar5 = Matrix4x4::operator()
                         ((Matrix4x4 *)in_stack_ffffffffffffee10,
                          (int)((ulong)in_stack_ffffffffffffee08 >> 0x20),
                          (int)in_stack_ffffffffffffee08);
      std::istream::operator>>((istream *)local_2c8,pdVar5);
      pdVar5 = Matrix4x4::operator()
                         ((Matrix4x4 *)in_stack_ffffffffffffee10,
                          (int)((ulong)in_stack_ffffffffffffee08 >> 0x20),
                          (int)in_stack_ffffffffffffee08);
      std::istream::operator>>((istream *)local_2c8,pdVar5);
      in_stack_fffffffffffff070 =
           (XMLElement *)
           Matrix4x4::operator()
                     ((Matrix4x4 *)in_stack_ffffffffffffee10,
                      (int)((ulong)in_stack_ffffffffffffee08 >> 0x20),(int)in_stack_ffffffffffffee08
                     );
      std::istream::operator>>((istream *)local_2c8,(double *)in_stack_fffffffffffff070);
      in_stack_fffffffffffff068 =
           (string *)
           Matrix4x4::operator()
                     ((Matrix4x4 *)in_stack_ffffffffffffee10,
                      (int)((ulong)in_stack_ffffffffffffee08 >> 0x20),(int)in_stack_ffffffffffffee08
                     );
      std::istream::operator>>((istream *)local_2c8,(double *)in_stack_fffffffffffff068);
      pdVar5 = Matrix4x4::operator()
                         ((Matrix4x4 *)in_stack_ffffffffffffee10,
                          (int)((ulong)in_stack_ffffffffffffee08 >> 0x20),
                          (int)in_stack_ffffffffffffee08);
      std::istream::operator>>((istream *)local_2c8,pdVar5);
      memcpy(local_88,local_348,0x80);
      local_34c = 3;
      std::__cxx11::stringstream::~stringstream(local_2c8);
      std::__cxx11::string::~string(local_138);
    }
    else {
      bVar2 = std::operator==(&in_stack_ffffffffffffee10->id,(char *)in_stack_ffffffffffffee08);
      if (bVar2) {
        Matrix4x4::Matrix4x4((Matrix4x4 *)in_stack_ffffffffffffee20);
        pcVar4 = tinyxml2::XMLElement::GetText(in_stack_ffffffffffffee08);
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_3f8,pcVar4,&local_3f9);
        std::allocator<char>::~allocator((allocator<char> *)&local_3f9);
        _Var3 = std::operator|(_S_out,_S_in);
        std::__cxx11::stringstream::stringstream(local_588,local_3f8,_Var3);
        pcVar4 = tinyxml2::XMLElement::Attribute
                           ((XMLElement *)in_stack_ffffffffffffee18,
                            (char *)in_stack_ffffffffffffee10,(char *)in_stack_ffffffffffffee08);
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_5a8,pcVar4,&local_5a9);
        std::allocator<char>::~allocator((allocator<char> *)&local_5a9);
        pcVar4 = (char *)std::__cxx11::string::back();
        cVar1 = *pcVar4;
        j = (int)in_stack_ffffffffffffee08;
        i = (int)((ulong)in_stack_ffffffffffffee08 >> 0x20);
        if (cVar1 == 'X') {
          pdVar5 = Matrix4x4::operator()((Matrix4x4 *)in_stack_ffffffffffffee10,i,j);
          std::istream::operator>>((istream *)local_588,pdVar5);
          pdVar5 = Matrix4x4::operator()
                             ((Matrix4x4 *)in_stack_ffffffffffffee10,
                              (int)((ulong)in_stack_ffffffffffffee08 >> 0x20),
                              (int)in_stack_ffffffffffffee08);
          std::istream::operator>>((istream *)local_588,pdVar5);
          pdVar5 = Matrix4x4::operator()
                             ((Matrix4x4 *)in_stack_ffffffffffffee10,
                              (int)((ulong)in_stack_ffffffffffffee08 >> 0x20),
                              (int)in_stack_ffffffffffffee08);
          std::istream::operator>>((istream *)local_588,pdVar5);
          pdVar5 = Matrix4x4::operator()
                             ((Matrix4x4 *)in_stack_ffffffffffffee10,
                              (int)((ulong)in_stack_ffffffffffffee08 >> 0x20),
                              (int)in_stack_ffffffffffffee08);
          std::istream::operator>>((istream *)local_588,pdVar5);
        }
        else if (cVar1 == 'Y') {
          pdVar5 = Matrix4x4::operator()((Matrix4x4 *)in_stack_ffffffffffffee10,i,j);
          std::istream::operator>>((istream *)local_588,pdVar5);
          pdVar5 = Matrix4x4::operator()
                             ((Matrix4x4 *)in_stack_ffffffffffffee10,
                              (int)((ulong)in_stack_ffffffffffffee08 >> 0x20),
                              (int)in_stack_ffffffffffffee08);
          std::istream::operator>>((istream *)local_588,pdVar5);
          pdVar5 = Matrix4x4::operator()
                             ((Matrix4x4 *)in_stack_ffffffffffffee10,
                              (int)((ulong)in_stack_ffffffffffffee08 >> 0x20),
                              (int)in_stack_ffffffffffffee08);
          std::istream::operator>>((istream *)local_588,pdVar5);
          pdVar5 = Matrix4x4::operator()
                             ((Matrix4x4 *)in_stack_ffffffffffffee10,
                              (int)((ulong)in_stack_ffffffffffffee08 >> 0x20),
                              (int)in_stack_ffffffffffffee08);
          std::istream::operator>>((istream *)local_588,pdVar5);
        }
        else if (cVar1 == 'Z') {
          pdVar5 = Matrix4x4::operator()((Matrix4x4 *)in_stack_ffffffffffffee10,i,j);
          std::istream::operator>>((istream *)local_588,pdVar5);
          pdVar5 = Matrix4x4::operator()
                             ((Matrix4x4 *)in_stack_ffffffffffffee10,
                              (int)((ulong)in_stack_ffffffffffffee08 >> 0x20),
                              (int)in_stack_ffffffffffffee08);
          std::istream::operator>>((istream *)local_588,pdVar5);
          pdVar5 = Matrix4x4::operator()
                             ((Matrix4x4 *)in_stack_ffffffffffffee10,
                              (int)((ulong)in_stack_ffffffffffffee08 >> 0x20),
                              (int)in_stack_ffffffffffffee08);
          std::istream::operator>>((istream *)local_588,pdVar5);
          pdVar5 = Matrix4x4::operator()
                             ((Matrix4x4 *)in_stack_ffffffffffffee10,
                              (int)((ulong)in_stack_ffffffffffffee08 >> 0x20),
                              (int)in_stack_ffffffffffffee08);
          std::istream::operator>>((istream *)local_588,pdVar5);
        }
        Matrix4x4::operator*(in_stack_ffffffffffffee78,(Matrix4x4 *)in_stack_ffffffffffffee70);
        memcpy(local_88,local_638,0x80);
        std::__cxx11::string::~string(local_5a8);
        std::__cxx11::stringstream::~stringstream(local_588);
        std::__cxx11::string::~string(local_3f8);
      }
      bVar2 = std::operator==(&in_stack_ffffffffffffee10->id,(char *)in_stack_ffffffffffffee08);
      if (bVar2) {
        Matrix4x4::Matrix4x4((Matrix4x4 *)in_stack_ffffffffffffee20);
        pcVar4 = tinyxml2::XMLElement::GetText(in_stack_ffffffffffffee08);
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_6d8,pcVar4,&local_6d9);
        std::allocator<char>::~allocator((allocator<char> *)&local_6d9);
        _Var3 = std::operator|(_S_out,_S_in);
        std::__cxx11::stringstream::stringstream(local_868,local_6d8,_Var3);
        pdVar5 = Matrix4x4::operator()
                           ((Matrix4x4 *)in_stack_ffffffffffffee10,
                            (int)((ulong)in_stack_ffffffffffffee08 >> 0x20),
                            (int)in_stack_ffffffffffffee08);
        std::istream::operator>>((istream *)local_868,pdVar5);
        pdVar5 = Matrix4x4::operator()
                           ((Matrix4x4 *)in_stack_ffffffffffffee10,
                            (int)((ulong)in_stack_ffffffffffffee08 >> 0x20),
                            (int)in_stack_ffffffffffffee08);
        std::istream::operator>>((istream *)local_868,pdVar5);
        pdVar5 = Matrix4x4::operator()
                           ((Matrix4x4 *)in_stack_ffffffffffffee10,
                            (int)((ulong)in_stack_ffffffffffffee08 >> 0x20),
                            (int)in_stack_ffffffffffffee08);
        std::istream::operator>>((istream *)local_868,pdVar5);
        Matrix4x4::operator*(in_stack_ffffffffffffee78,(Matrix4x4 *)in_stack_ffffffffffffee70);
        memcpy(local_88,local_8e8,0x80);
        std::__cxx11::stringstream::~stringstream(local_868);
        std::__cxx11::string::~string(local_6d8);
      }
      bVar2 = std::operator==(&in_stack_ffffffffffffee10->id,(char *)in_stack_ffffffffffffee08);
      if (bVar2) {
        Matrix4x4::Matrix4x4((Matrix4x4 *)in_stack_ffffffffffffee20);
        pcVar4 = tinyxml2::XMLElement::GetText(in_stack_ffffffffffffee08);
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_988,pcVar4,&local_989);
        std::allocator<char>::~allocator((allocator<char> *)&local_989);
        _Var3 = std::operator|(_S_out,_S_in);
        std::__cxx11::stringstream::stringstream(local_b18,local_988,_Var3);
        pdVar5 = Matrix4x4::operator()
                           ((Matrix4x4 *)in_stack_ffffffffffffee10,
                            (int)((ulong)in_stack_ffffffffffffee08 >> 0x20),
                            (int)in_stack_ffffffffffffee08);
        std::istream::operator>>((istream *)local_b18,pdVar5);
        pdVar5 = Matrix4x4::operator()
                           ((Matrix4x4 *)in_stack_ffffffffffffee10,
                            (int)((ulong)in_stack_ffffffffffffee08 >> 0x20),
                            (int)in_stack_ffffffffffffee08);
        std::istream::operator>>((istream *)local_b18,pdVar5);
        pdVar5 = Matrix4x4::operator()
                           ((Matrix4x4 *)in_stack_ffffffffffffee10,
                            (int)((ulong)in_stack_ffffffffffffee08 >> 0x20),
                            (int)in_stack_ffffffffffffee08);
        std::istream::operator>>((istream *)local_b18,pdVar5);
        Matrix4x4::operator*(in_stack_ffffffffffffee78,(Matrix4x4 *)in_stack_ffffffffffffee70);
        memcpy(local_88,local_b98,0x80);
        std::__cxx11::stringstream::~stringstream(local_b18);
        std::__cxx11::string::~string(local_988);
      }
      local_f0 = tinyxml2::XMLNode::NextSiblingElement
                           ((XMLNode *)in_stack_ffffffffffffee10,(char *)in_stack_ffffffffffffee08);
      local_34c = 0;
    }
    std::__cxx11::string::~string(local_110);
  } while (local_34c == 0);
  Matrix4x4::Matrix4x4(in_stack_ffffffffffffee30,in_stack_ffffffffffffee28);
  Matrix4x4::operator*(in_stack_ffffffffffffee78,(Matrix4x4 *)in_stack_ffffffffffffee70);
  local_88[0xc] = local_c38;
  local_88[0xd] = uStack_c30;
  local_88[0xe] = uStack_c28;
  local_88[8] = local_c58;
  local_88[9] = uStack_c50;
  local_88[10] = uStack_c48;
  local_88[0xb] = uStack_c40;
  local_88[4] = local_c78;
  local_88[5] = uStack_c70;
  local_88[6] = uStack_c68;
  local_88[7] = uStack_c60;
  local_88[0] = local_c98;
  local_88[1] = uStack_c90;
  local_88[2] = uStack_c88;
  local_88[3] = uStack_c80;
  transform._96_8_ = local_c38;
  transform._104_8_ = uStack_c30;
  transform._112_8_ = uStack_c28;
  transform._120_8_ = pXStack_c20;
  transform._64_8_ = local_c58;
  transform._72_8_ = uStack_c50;
  transform._80_8_ = uStack_c48;
  transform._88_8_ = uStack_c40;
  transform._32_8_ = local_c78;
  transform._40_8_ = uStack_c70;
  transform._48_8_ = uStack_c68;
  transform._56_8_ = uStack_c60;
  transform._0_8_ = local_c98;
  transform._8_8_ = uStack_c90;
  transform._16_8_ = uStack_c88;
  transform._24_8_ = uStack_c80;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_cc0,"node",&local_cc1);
  pXVar6 = get_element(in_stack_fffffffffffff070,in_stack_fffffffffffff068);
  std::__cxx11::string::~string(local_cc0);
  std::allocator<char>::~allocator((allocator<char> *)&local_cc1);
  local_ca0 = pXVar6;
  while (local_ca0 != (XMLElement *)0x0) {
    parse_node(pXStack_c20);
    local_ca0 = tinyxml2::XMLNode::NextSiblingElement
                          ((XMLNode *)in_stack_ffffffffffffee10,(char *)in_stack_ffffffffffffee08);
  }
  transform._96_8_ = local_bb8;
  transform._104_8_ = uStack_bb0;
  transform._112_8_ = uStack_ba8;
  transform._120_8_ = uStack_ba0;
  transform._64_8_ = local_bd8;
  transform._72_8_ = uStack_bd0;
  transform._80_8_ = uStack_bc8;
  transform._88_8_ = uStack_bc0;
  transform._32_8_ = local_bf8;
  transform._40_8_ = uStack_bf0;
  transform._48_8_ = uStack_be8;
  transform._56_8_ = uStack_be0;
  transform._0_8_ = local_c18;
  transform._8_8_ = uStack_c10;
  transform._16_8_ = uStack_c08;
  transform._24_8_ = uStack_c00;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_cf0,"instance_camera",&local_cf1);
  camera_00 = (CameraInfo *)get_element(in_stack_fffffffffffff070,in_stack_fffffffffffff068);
  std::__cxx11::string::~string(local_cf0);
  std::allocator<char>::~allocator((allocator<char> *)&local_cf1);
  local_cd0 = camera_00;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_d20,"instance_light",&local_d21);
  pXVar6 = get_element(in_stack_fffffffffffff070,in_stack_fffffffffffff068);
  std::__cxx11::string::~string(local_d20);
  std::allocator<char>::~allocator((allocator<char> *)&local_d21);
  local_d00 = pXVar6;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_d50,"instance_geometry",&local_d51);
  pXVar6 = get_element(in_stack_fffffffffffff070,in_stack_fffffffffffff068);
  std::__cxx11::string::~string(local_d50);
  std::allocator<char>::~allocator((allocator<char> *)&local_d51);
  local_d30 = pXVar6;
  if (local_cd0 == (CameraInfo *)0x0) {
    if (local_d00 == (XMLElement *)0x0) {
      if (pXVar6 != (XMLElement *)0x0) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_d88,"mesh",&local_d89);
        pXVar6 = get_element(in_stack_fffffffffffff070,in_stack_fffffffffffff068);
        std::__cxx11::string::~string(local_d88);
        std::allocator<char>::~allocator((allocator<char> *)&local_d89);
        if (pXVar6 == (XMLElement *)0x0) {
          sphere_00 = (SphereInfo *)local_e41;
          std::allocator<char>::allocator();
          std::__cxx11::string::string((string *)(local_e41 + 1),"extra",(allocator *)sphere_00);
          pXVar6 = get_element(in_stack_fffffffffffff070,in_stack_fffffffffffff068);
          std::__cxx11::string::~string((string *)(local_e41 + 1));
          std::allocator<char>::~allocator((allocator<char> *)local_e41);
          if (pXVar6 != (XMLElement *)0x0) {
            pauVar7 = (undefined1 (*) [32])operator_new(0x58);
            auVar8 = ZEXT816(0) << 0x40;
            *(undefined1 (*) [32])(pauVar7[1] + 0x18) = ZEXT1632(auVar8);
            pauVar7[1] = ZEXT1632(auVar8);
            *pauVar7 = ZEXT1632(auVar8);
            SphereInfo::SphereInfo((SphereInfo *)0x1211d9);
            local_e50 = pauVar7;
            parse_sphere(in_stack_ffffffffffffee70,sphere_00);
            std::allocator<char>::allocator();
            std::__cxx11::string::string
                      (local_e78,
                       "instance_geometry/bind_material/technique_common/instance_material",
                       &local_e79);
            pXVar6 = get_element(in_stack_fffffffffffff070,in_stack_fffffffffffff068);
            std::__cxx11::string::~string(local_e78);
            std::allocator<char>::~allocator((allocator<char> *)&local_e79);
            local_e58 = pXVar6;
            if (pXVar6 != (XMLElement *)0x0) {
              pcVar4 = tinyxml2::XMLElement::Attribute
                                 ((XMLElement *)in_stack_ffffffffffffee18,
                                  (char *)in_stack_ffffffffffffee10,
                                  (char *)in_stack_ffffffffffffee08);
              if (pcVar4 == (char *)0x0) {
                exit(1);
              }
              pcVar4 = tinyxml2::XMLElement::Attribute
                                 ((XMLElement *)in_stack_ffffffffffffee18,
                                  (char *)in_stack_ffffffffffffee10,
                                  (char *)in_stack_ffffffffffffee08);
              in_stack_ffffffffffffee18 = (value_type *)(pcVar4 + 1);
              in_stack_ffffffffffffee20 = (Node *)local_ea1;
              std::allocator<char>::allocator();
              std::__cxx11::string::string
                        ((string *)(local_ea1 + 1),(char *)in_stack_ffffffffffffee18,
                         (allocator *)in_stack_ffffffffffffee20);
              std::allocator<char>::~allocator((allocator<char> *)local_ea1);
              std::__cxx11::string::string(local_ed0,(string *)(local_ea1 + 1));
              in_stack_ffffffffffffee10 = (Node *)uri_find(&in_stack_ffffffffffffee20->id);
              std::__cxx11::string::~string(local_ed0);
              local_eb0 = in_stack_ffffffffffffee10;
              if (in_stack_ffffffffffffee10 == (Node *)0x0) {
                exit(1);
              }
              pauVar7 = (undefined1 (*) [32])operator_new(0x50);
              auVar8 = ZEXT816(0) << 0x40;
              *(undefined1 (*) [32])(pauVar7[1] + 0x10) = ZEXT1632(auVar8);
              pauVar7[1] = ZEXT1632(auVar8);
              *pauVar7 = ZEXT1632(auVar8);
              MaterialInfo::MaterialInfo((MaterialInfo *)0x12149e);
              parse_material(in_stack_fffffffffffff890,in_stack_fffffffffffff888);
              *(undefined1 (**) [32])(local_e50 + 0x50) = pauVar7;
              std::__cxx11::string::~string((string *)(local_ea1 + 1));
            }
            local_98 = (undefined1 (*) [32])local_e50;
          }
        }
        else {
          pauVar7 = (undefined1 (*) [32])operator_new(0xb0);
          auVar8 = ZEXT816(0) << 0x40;
          *(undefined1 (*) [32])(pauVar7[4] + 0x10) = ZEXT1632(auVar8);
          pauVar7[4] = ZEXT1632(auVar8);
          auVar9 = ZEXT1632(auVar8);
          pauVar7[3] = auVar9;
          pauVar7[2] = auVar9;
          pauVar7[1] = auVar9;
          *pauVar7 = auVar9;
          PolymeshInfo::PolymeshInfo((PolymeshInfo *)in_stack_ffffffffffffee10);
          local_d98 = pauVar7;
          parse_polymesh(in_stack_fffffffffffff8a0,in_stack_fffffffffffff898);
          std::allocator<char>::allocator();
          std::__cxx11::string::string
                    (local_dc0,"instance_geometry/bind_material/technique_common/instance_material",
                     &local_dc1);
          pXVar6 = get_element(in_stack_fffffffffffff070,in_stack_fffffffffffff068);
          std::__cxx11::string::~string(local_dc0);
          std::allocator<char>::~allocator((allocator<char> *)&local_dc1);
          local_da0 = pXVar6;
          if (pXVar6 != (XMLElement *)0x0) {
            pcVar4 = tinyxml2::XMLElement::Attribute
                               ((XMLElement *)in_stack_ffffffffffffee18,
                                (char *)in_stack_ffffffffffffee10,(char *)in_stack_ffffffffffffee08)
            ;
            if (pcVar4 == (char *)0x0) {
              exit(1);
            }
            pcVar4 = tinyxml2::XMLElement::Attribute
                               ((XMLElement *)in_stack_ffffffffffffee18,
                                (char *)in_stack_ffffffffffffee10,(char *)in_stack_ffffffffffffee08)
            ;
            std::allocator<char>::allocator();
            std::__cxx11::string::string(local_de8,pcVar4 + 1,&local_de9);
            std::allocator<char>::~allocator((allocator<char> *)&local_de9);
            std::__cxx11::string::string(local_e18,local_de8);
            pXVar6 = uri_find(&in_stack_ffffffffffffee20->id);
            std::__cxx11::string::~string(local_e18);
            local_df8 = pXVar6;
            if (pXVar6 == (XMLElement *)0x0) {
              exit(1);
            }
            pauVar7 = (undefined1 (*) [32])operator_new(0x50);
            auVar8 = ZEXT816(0) << 0x40;
            *(undefined1 (*) [32])(pauVar7[1] + 0x10) = ZEXT1632(auVar8);
            pauVar7[1] = ZEXT1632(auVar8);
            *pauVar7 = ZEXT1632(auVar8);
            MaterialInfo::MaterialInfo((MaterialInfo *)0x1210bc);
            local_e41._33_8_ = pauVar7;
            parse_material(in_stack_fffffffffffff890,in_stack_fffffffffffff888);
            *(undefined8 *)(local_d98[5] + 8) = local_e41._33_8_;
            std::__cxx11::string::~string(local_de8);
          }
          local_98 = local_d98;
        }
      }
    }
    else {
      pauVar7 = (undefined1 (*) [32])operator_new(0xf0);
      LightInfo::LightInfo(in_stack_ffffffffffffeea0);
      local_d68 = pauVar7;
      parse_light(in_stack_fffffffffffff4a0,in_stack_fffffffffffff498);
      local_98 = local_d68;
    }
  }
  else {
    pauVar7 = (undefined1 (*) [32])operator_new(0xa0);
    auVar8 = ZEXT816(0) << 0x40;
    pauVar7[4] = ZEXT1632(auVar8);
    pauVar7[3] = ZEXT1632(auVar8);
    auVar9 = ZEXT1632(auVar8);
    pauVar7[2] = auVar9;
    pauVar7[1] = auVar9;
    *pauVar7 = auVar9;
    CameraInfo::CameraInfo((CameraInfo *)in_stack_ffffffffffffee20);
    local_d60 = pauVar7;
    parse_camera(in_RDI,camera_00);
    local_98 = local_d60;
  }
  std::vector<CGL::Collada::Node,_std::allocator<CGL::Collada::Node>_>::push_back
            ((vector<CGL::Collada::Node,_std::allocator<CGL::Collada::Node>_> *)
             in_stack_ffffffffffffee20,in_stack_ffffffffffffee18);
  Node::~Node(in_stack_ffffffffffffee10);
  return;
}

Assistant:

void ColladaParser::parse_node( XMLElement* xml ) {

  // create new node
  Node node = Node();

  // name & id
  node.id   = xml->Attribute( "id" );
  node.name = xml->Attribute("name");
  stat(" |- Node: " << node.name << " (id:" << node.id << ")");

  // node transformation -
  // combine in order of declaration if the transformations are given as a
  // transformation list
  XMLElement* e = xml->FirstChildElement();
  while (e) {

    string name = e->Name();

    // transformation - matrix
    if (name == "matrix") {

      string s = e->GetText();
      stringstream ss (s);

      Matrix4x4 mat;
      ss >> mat(0,0); ss >> mat(0,1); ss >> mat(0,2); ss >> mat(0,3);
      ss >> mat(1,0); ss >> mat(1,1); ss >> mat(1,2); ss >> mat(1,3);
      ss >> mat(2,0); ss >> mat(2,1); ss >> mat(2,2); ss >> mat(2,3);
      ss >> mat(3,0); ss >> mat(3,1); ss >> mat(3,2); ss >> mat(3,3);

      node.transform = mat; break;

    }

    // transformation - rotate
    if (name == "rotate") {

      Matrix4x4 m;

      string s = e->GetText();
      stringstream ss (s);

      string sid = e->Attribute("sid");
      switch (sid.back()) {
        case 'X':
          ss >> m(1,1); ss >> m(1,2);
          ss >> m(2,1); ss >> m(2,2);
          break;
        case 'Y':
          ss >> m(0,0); ss >> m(2,0);
          ss >> m(0,2); ss >> m(2,2);
          break;
        case 'Z':
          ss >> m(0,0); ss >> m(0,1);
          ss >> m(1,0); ss >> m(1,1);
          break;
        default:
          break;
      }

      node.transform = m * node.transform;

    }

    // transformation - translate
    if (name == "translate") {

      Matrix4x4 m;

      string s = e->GetText();
      stringstream ss (s);

      ss >> m(0,3); ss >> m(1,3); ss >> m(2,3);

      node.transform = m * node.transform;
    }

    // transformation - scale
    if (name == "scale") {

      Matrix4x4 m;

      string s = e->GetText();
      stringstream ss (s);

      ss >> m(0,0); ss >> m(1,1); ss >> m(1,1);

      node.transform = m * node.transform;
    }

    // transformation - skew
    // Note (sky): ignored for now

    // transformation - lookat
    // Note (sky): ignored for now

    e = e->NextSiblingElement();
  }

  // push transformations
  Matrix4x4 transform_save = transform;

  // combine transformations
  node.transform = transform * node.transform;
  transform = node.transform;

  // parse child nodes if node is a joint
  XMLElement* e_child = get_element(xml, "node");
  while (e_child) {
    parse_node(e_child);
    e_child = e_child->NextSiblingElement("node");
  }

  // pop transformations
  transform = transform_save;

  // node instance -
  // non-joint nodes must contain a scene object instance
  XMLElement* e_camera   = get_element(xml, "instance_camera");
  XMLElement* e_light    = get_element(xml, "instance_light");
  XMLElement* e_geometry = get_element(xml, "instance_geometry");

  if (e_camera) {
    CameraInfo* camera = new CameraInfo();
    parse_camera( e_camera, *camera );
    node.instance = camera;
  } else if (e_light) {
    LightInfo* light = new LightInfo();
    parse_light( e_light, *light );
    node.instance = light;
  } else if (e_geometry) {
    if (get_element(e_geometry, "mesh")) {

      // mesh geometry
      PolymeshInfo* polymesh = new PolymeshInfo();
      parse_polymesh(e_geometry, *polymesh);

      // mesh material
      XMLElement* e_instance_material = get_element(xml,
      "instance_geometry/bind_material/technique_common/instance_material");
      if (e_instance_material) {

        if (!e_instance_material->Attribute("target")) {
          stat("Error: no target material in instance: " << e_instance_material);
          exit(EXIT_FAILURE);
        }

        string material_id = e_instance_material->Attribute("target") + 1;
        XMLElement* e_material = uri_find(material_id);
        if (!e_material) {
          stat("Error: invalid target material id : " << material_id);
          exit(EXIT_FAILURE);
        }

        MaterialInfo* material = new MaterialInfo();
        parse_material(e_material, *material);
        polymesh->material = material;
      }

      node.instance = polymesh;

    } else if (get_element(e_geometry, "extra")) {

      // sphere geometry
      SphereInfo* sphere = new SphereInfo();
      parse_sphere(e_geometry, *sphere);

      // sphere material
      XMLElement* e_instance_material = get_element(xml,
      "instance_geometry/bind_material/technique_common/instance_material");
      if (e_instance_material) {

        if (!e_instance_material->Attribute("target")) {
          stat("Error: no target material in instance: " << e_instance_material);
          exit(EXIT_FAILURE);
        }

        string material_id = e_instance_material->Attribute("target") + 1;
        XMLElement* e_material = uri_find(material_id);
        if (!e_material) {
          stat("Error: invalid target material id : " << material_id);
          exit(EXIT_FAILURE);
        }

        MaterialInfo* material = new MaterialInfo();
        parse_material(e_material, *material);
        sphere->material = material;
      }

      node.instance = sphere;

    }
  }

  // add node to scene
  scene->nodes.push_back(node);
}